

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_valued_inverse_fast_fourier_transform.cc
# Opt level: O1

bool __thiscall
sptk::RealValuedInverseFastFourierTransform::Run
          (RealValuedInverseFastFourierTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  int iVar1;
  pointer pdVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  if (buffer == (Buffer *)0x0) {
    return false;
  }
  bVar3 = RealValuedFastFourierTransform::Run
                    (&this->fast_fourier_transform_,real_part_input,real_part_output,
                     imag_part_output,&buffer->fast_fourier_transform_buffer_);
  if (bVar3) {
    iVar1 = (this->fast_fourier_transform_).fft_length_;
    lVar4 = (long)iVar1;
    if (lVar4 != 0) {
      pdVar2 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = 0;
      do {
        *(double *)((long)pdVar2 + lVar5) =
             *(double *)((long)pdVar2 + lVar5) * (1.0 / (double)iVar1);
        lVar5 = lVar5 + 8;
      } while (lVar4 * 8 - lVar5 != 0);
    }
    bVar3 = true;
    if (iVar1 != 0) {
      pdVar2 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = 0;
      do {
        *(double *)((long)pdVar2 + lVar5) =
             *(double *)((long)pdVar2 + lVar5) * (1.0 / (double)iVar1);
        lVar5 = lVar5 + 8;
      } while (lVar4 * 8 != lVar5);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool RealValuedInverseFastFourierTransform::Run(
    const std::vector<double>& real_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    RealValuedInverseFastFourierTransform::Buffer* buffer) const {
  if (NULL == buffer) {
    return false;
  }

  if (!fast_fourier_transform_.Run(real_part_input, real_part_output,
                                   imag_part_output,
                                   &buffer->fast_fourier_transform_buffer_)) {
    return false;
  }

  const int fft_length(fast_fourier_transform_.GetFftLength());
  const double z(1.0 / fft_length);
  std::transform(real_part_output->begin(),
                 real_part_output->begin() + fft_length,
                 real_part_output->begin(), [z](double x) { return x * z; });
  std::transform(imag_part_output->begin(),
                 imag_part_output->begin() + fft_length,
                 imag_part_output->begin(), [z](double x) { return x * z; });

  return true;
}